

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::reverseBits(APInt *this)

{
  uchar in [1];
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long val;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  uint uVar5;
  APInt *in_RSI;
  APInt AVar6;
  APInt Val;
  
  uVar5 = in_RSI->BitWidth;
  switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
  case 0:
    val = (unsigned_long)(byte)BitReverseTable256[*(byte *)&in_RSI->U];
    break;
  case 1:
    uVar2 = reverseBits<unsigned_short>(*(unsigned_short *)&in_RSI->U);
    val = (unsigned_long)uVar2;
    break;
  default:
    APInt(&Val,in_RSI);
    APInt(this,in_RSI->BitWidth,0,false);
    uVar5 = in_RSI->BitWidth;
    while (bVar1 = operator!=(&Val,0), bVar1) {
      operator<<=(this,1);
      bVar1 = operator[](&Val,0);
      operator|=(this,(ulong)bVar1);
      uVar5 = uVar5 - 1;
      lshrInPlace(&Val,1);
    }
    operator<<=(this,uVar5);
    ~APInt(&Val);
    uVar4 = extraout_RDX_00;
    goto LAB_001840a9;
  case 3:
    uVar3 = reverseBits<unsigned_int>(*(uint *)&in_RSI->U);
    val = (unsigned_long)uVar3;
    break;
  case 7:
    val = reverseBits<unsigned_long>((in_RSI->U).VAL);
  }
  APInt(this,uVar5,val,false);
  uVar4 = extraout_RDX;
LAB_001840a9:
  AVar6._8_8_ = uVar4;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::reverseBits() const {
  switch (BitWidth) {
  case 64:
    return APInt(BitWidth, llvm::reverseBits<uint64_t>(U.VAL));
  case 32:
    return APInt(BitWidth, llvm::reverseBits<uint32_t>(U.VAL));
  case 16:
    return APInt(BitWidth, llvm::reverseBits<uint16_t>(U.VAL));
  case 8:
    return APInt(BitWidth, llvm::reverseBits<uint8_t>(U.VAL));
  default:
    break;
  }

  APInt Val(*this);
  APInt Reversed(BitWidth, 0);
  unsigned S = BitWidth;

  for (; Val != 0; Val.lshrInPlace(1)) {
    Reversed <<= 1;
    Reversed |= Val[0];
    --S;
  }

  Reversed <<= S;
  return Reversed;
}